

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O0

void __thiscall imrt::ACS::search(ACS *this,int max_eval)

{
  ostream *poVar1;
  void *this_00;
  EVP_PKEY_CTX *src;
  int in_ESI;
  ApertureILS *in_RDI;
  double dVar2;
  ACO *unaff_retaddr;
  ACO *in_stack_00000020;
  int iteration;
  int current_eval;
  Ant *in_stack_000000a0;
  undefined1 verbose;
  Plan *in_stack_ffffffffffffffd8;
  int local_14;
  int local_10;
  ApertureILS *a;
  
  local_10 = 0;
  local_14 = 1;
  a = in_RDI;
  while (local_10 + (in_RDI->super_ILS).bsize <= in_ESI) {
    (*(in_RDI->super_ILS)._vptr_ILS[2])();
    verbose = (undefined1)((ulong)(in_RDI->super_ILS).time_begin >> 0x38);
    Ant::getPlan((Ant *)in_RDI[1].tabu.
                        super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                        ._M_impl._M_node._M_size);
    ApertureILS::simpleLocalSearch(in_RDI,in_stack_ffffffffffffffd8,(bool)verbose);
    Ant::generateReference(in_stack_000000a0);
    local_10 = local_10 + (in_RDI->super_ILS).bsize;
    in_stack_ffffffffffffffd8 = (Plan *)Ant::getEvaluation((Ant *)0x13e08e);
    dVar2 = Ant::getEvaluation((Ant *)0x13e0a5);
    if (dVar2 < (double)in_stack_ffffffffffffffd8) {
      Ant::copy((Ant *)in_RDI[2].super_ILS._vptr_ILS,
                (EVP_PKEY_CTX *)
                in_RDI[1].tabu.
                super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                ._M_impl._M_node._M_size,src);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    poVar1 = std::operator<<(poVar1," n_evals: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1," iter_best: ");
    dVar2 = Ant::getEvaluation((Ant *)0x13e12e);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
    poVar1 = std::operator<<(poVar1," global_best: ");
    dVar2 = Ant::getEvaluation((Ant *)0x13e160);
    this_00 = (void *)std::ostream::operator<<(poVar1,dVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    ACO::evaporation(in_stack_00000020);
    ACO::globalDeposit(unaff_retaddr,(Ant *)a);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void ACS::search(int max_eval) {
    int current_eval = 0;
    int iteration = 1;
    while ( (current_eval+ n_ants) <= max_eval) {
      generateTours();
      
      ils->simpleLocalSearch (*(iteration_best->getPlan()), false);
      iteration_best->generateReference();
      
      current_eval = current_eval + n_ants;
      if (global_best->getEvaluation() > iteration_best->getEvaluation())
        global_best->copy(*iteration_best);
      cout << "Iteration: " << iteration << " n_evals: "<< current_eval <<
          " iter_best: " << iteration_best->getEvaluation() <<
          " global_best: " << global_best->getEvaluation()<<endl;
      //iteration_best->printIntensities();
      evaporation();
      globalDeposit(global_best);
      iteration++;
      //printPheromone();
    }
     
  }